

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMLMatrix33.cpp
# Opt level: O0

Matrix33 * AML::diag(Matrix33 *__return_storage_ptr__,Vector3 *rhs)

{
  double local_58;
  double data [3] [3];
  Vector3 *rhs_local;
  
  local_58 = (rhs->field_0).data[0];
  data[0][0] = 0.0;
  data[0][1] = 0.0;
  data[0][2] = 0.0;
  data[1][0] = (rhs->field_0).data[1];
  data[1][1] = 0.0;
  data[1][2] = 0.0;
  data[2][0] = 0.0;
  data[2][1] = (rhs->field_0).data[2];
  data[2][2] = (double)rhs;
  Matrix33::Matrix33(__return_storage_ptr__,(double (*) [3])&local_58);
  return __return_storage_ptr__;
}

Assistant:

Matrix33 diag(const Vector3& rhs)
    {
        double data[3][3];
        data[0][0] = rhs.x;
        data[0][1] = 0.0;
        data[0][2] = 0.0;
        data[1][0] = 0.0;
        data[1][1] = rhs.y;
        data[1][2] = 0.0;
        data[2][0] = 0.0;
        data[2][1] = 0.0;
        data[2][2] = rhs.z;
        return Matrix33(data);
    }